

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

void __thiscall
kratos::FSMState::next
          (FSMState *this,shared_ptr<kratos::FSMState> *next_state,shared_ptr<kratos::Var> *cond)

{
  initializer_list<const_kratos::IRNode_*> __l;
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  UserException *pUVar4;
  FSM *pFVar5;
  element_type *peVar6;
  string *args;
  element_type *peVar7;
  VarException *this_00;
  runtime_error *this_01;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  pair<kratos::Var_*,_kratos::FSMState_*> local_388;
  undefined1 local_371;
  char local_370 [32];
  string local_350;
  undefined1 local_32a;
  allocator<const_kratos::IRNode_*> local_329;
  Var *local_328;
  Var **local_320;
  size_type local_318;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_310;
  allocator<char> local_2f1;
  string local_2f0;
  element_type *local_2d0;
  element_type *ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  FSMState *local_2a0;
  pair<std::nullptr_t,_kratos::FSMState_*> local_298;
  anon_class_8_1_8991fb9c local_288;
  anon_class_8_1_8991fb9c find_match;
  string local_278;
  FSM *local_258;
  FSM *fsm;
  element_type *state_ptr;
  FSM *parent;
  string local_230;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *local_210;
  shared_ptr<kratos::Var> *cond_local;
  shared_ptr<kratos::FSMState> *next_state_local;
  FSMState *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_1f0;
  basic_string_view<char> local_1e8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1b0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  string *local_1a0;
  char *local_198;
  string *local_190;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_188;
  basic_string_view<char> local_178;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_138;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  string *local_128;
  string *local_120;
  char *local_118;
  string *local_110;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_108;
  basic_string_view<char> local_f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  string *local_a0;
  char (*local_98) [42];
  char *local_90;
  string *local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_80;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_70;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_68;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_210 = &cond->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
  cond_local = (shared_ptr<kratos::Var> *)next_state;
  next_state_local = (shared_ptr<kratos::FSMState> *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)next_state);
  if ((!bVar1) ||
     (peVar3 = std::__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)cond_local), peVar3->parent_ == (FSM *)0x0)) {
    parent._3_1_ = 1;
    pUVar4 = (UserException *)__cxa_allocate_exception(0x10);
    local_1a0 = FSM::fsm_name_abi_cxx11_(this->parent_);
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&this->name_;
    local_190 = &local_230;
    local_198 = "Next state for {0}.{1} cannot be null";
    fmt::v7::make_args_checked<std::__cxx11::string_const&,std::__cxx11::string&,char[38],char>
              (&local_1d8,(v7 *)"Next state for {0}.{1} cannot be null",(char (*) [38])local_1a0,
               (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs,in_R8);
    local_1b0 = &local_1d8;
    local_1e8 = fmt::v7::to_string_view<char,_0>(local_198);
    local_78 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_80 = local_1b0;
    local_70 = local_1b0;
    local_60 = local_1b0;
    local_68 = local_78;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_78,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_1b0);
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_1e8.size_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_1f0.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_230,(detail *)local_1e8.data_,format_str,args_00);
    UserException::UserException(pUVar4,&local_230);
    parent._3_1_ = 0;
    __cxa_throw(pUVar4,&UserException::typeinfo,UserException::~UserException);
  }
  state_ptr = (element_type *)this->parent_;
  fsm = (FSM *)std::__shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2> *)cond_local);
  while (pFVar5 = FSM::parent_fsm((FSM *)state_ptr), pFVar5 != (FSM *)0x0) {
    state_ptr = (element_type *)FSM::parent_fsm((FSM *)state_ptr);
  }
  peVar3 = std::__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)cond_local);
  for (local_258 = peVar3->parent_; local_258 != (FSM *)0x0 && local_258 != (FSM *)state_ptr;
      local_258 = FSM::parent_fsm(local_258)) {
  }
  if (local_258 != (FSM *)state_ptr) {
    find_match.this._7_1_ = 1;
    pUVar4 = (UserException *)__cxa_allocate_exception(0x10);
    peVar3 = std::__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)cond_local);
    peVar6 = std::__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)cond_local);
    args = FSM::fsm_name_abi_cxx11_(peVar6->parent_);
    vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)FSM::fsm_name_abi_cxx11_((FSM *)state_ptr);
    local_110 = &local_278;
    local_118 = "FSM state {0} belongs to a different FSM {1} than {2}";
    local_128 = args;
    local_120 = &peVar3->name_;
    fmt::v7::
    make_args_checked<std::__cxx11::string&,std::__cxx11::string_const&,std::__cxx11::string_const&,char[54],char>
              (&local_168,(v7 *)"FSM state {0} belongs to a different FSM {1} than {2}",
               (char (*) [54])&peVar3->name_,args,
               (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs_1,
               (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)in_R9.values_);
    local_138 = &local_168;
    local_178 = fmt::v7::to_string_view<char,_0>(local_118);
    local_50 = &local_188;
    local_58 = local_138;
    local_48 = local_138;
    local_38 = local_138;
    local_40 = local_50;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_50,0xddd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_138);
    format_str_00.size_ = local_188.desc_;
    format_str_00.data_ = (char *)local_178.size_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_188.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_278,(detail *)local_178.data_,format_str_00,args_01);
    UserException::UserException(pUVar4,&local_278);
    find_match.this._7_1_ = 0;
    __cxa_throw(pUVar4,&UserException::typeinfo,UserException::~UserException);
  }
  local_288.this = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_210);
  if (bVar1) {
    bVar1 = next::anon_class_8_1_8991fb9c::operator()(&local_288,(Var *)0x0);
    if (bVar1) {
      ptr._7_1_ = 1;
      pUVar4 = (UserException *)__cxa_allocate_exception(0x10);
      std::operator+(&local_2c0,"Unconditional transition has been assign to ",&this->name_);
      UserException::UserException(pUVar4,&local_2c0);
      ptr._7_1_ = 0;
      __cxa_throw(pUVar4,&UserException::typeinfo,UserException::~UserException);
    }
    local_2d0 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get(local_210);
    peVar7 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_210);
    iVar2 = (*(peVar7->super_IRNode)._vptr_IRNode[7])();
    if (iVar2 != 1) {
      local_32a = 1;
      this_00 = (VarException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,"Condition has to be a boolean value",&local_2f1);
      local_328 = local_2d0;
      local_320 = &local_328;
      local_318 = 1;
      std::allocator<const_kratos::IRNode_*>::allocator(&local_329);
      __l._M_len = local_318;
      __l._M_array = (iterator)local_320;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_310,__l,&local_329);
      VarException::VarException(this_00,&local_2f0,&local_310);
      local_32a = 0;
      __cxa_throw(this_00,&VarException::typeinfo,VarException::~VarException);
    }
    bVar1 = next::anon_class_8_1_8991fb9c::operator()(&local_288,local_2d0);
    if (bVar1) {
      local_371 = 1;
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      (*(local_2d0->super_IRNode)._vptr_IRNode[0x1f])(local_370);
      local_a0 = FSM::fsm_name_abi_cxx11_(this->parent_);
      vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&this->name_;
      local_88 = &local_350;
      local_90 = "{0} has been added to FSM {1}-{2} already";
      local_98 = (char (*) [42])local_370;
      fmt::v7::
      make_args_checked<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string&,char[42],char>
                (&local_e8,(v7 *)"{0} has been added to FSM {1}-{2} already",local_98,local_a0,
                 (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs_2,
                 (remove_reference_t<std::__cxx11::basic_string<char>_&> *)in_R9.values_);
      local_b0 = &local_e8;
      local_f8 = fmt::v7::to_string_view<char,_0>(local_90);
      local_28 = &local_108;
      local_30 = local_b0;
      local_20 = local_b0;
      local_10 = local_b0;
      local_18 = local_28;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_28,0xddd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_b0);
      format_str_01.size_ = local_108.desc_;
      format_str_01.data_ = (char *)local_f8.size_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_108.field_1.values_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_350,(detail *)local_f8.data_,format_str_01,args_02)
      ;
      std::runtime_error::runtime_error(this_01,(string *)&local_350);
      local_371 = 0;
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_388 = std::make_pair<kratos::Var*&,kratos::FSMState*&>(&local_2d0,(FSMState **)&fsm);
    std::
    vector<std::pair<kratos::Var*,kratos::FSMState*>,std::allocator<std::pair<kratos::Var*,kratos::FSMState*>>>
    ::emplace_back<std::pair<kratos::Var*,kratos::FSMState*>>
              ((vector<std::pair<kratos::Var*,kratos::FSMState*>,std::allocator<std::pair<kratos::Var*,kratos::FSMState*>>>
                *)&this->transitions_,&local_388);
  }
  else {
    local_2a0 = (FSMState *)0x0;
    std::make_pair<decltype(nullptr),kratos::FSMState*&>(&local_298.first,&local_2a0);
    std::
    vector<std::pair<kratos::Var*,kratos::FSMState*>,std::allocator<std::pair<kratos::Var*,kratos::FSMState*>>>
    ::emplace_back<std::pair<decltype(nullptr),kratos::FSMState*>>
              ((vector<std::pair<kratos::Var*,kratos::FSMState*>,std::allocator<std::pair<kratos::Var*,kratos::FSMState*>>>
                *)&this->transitions_,&local_298);
  }
  return;
}

Assistant:

void FSMState::next(const std::shared_ptr<FSMState>& next_state, const std::shared_ptr<Var>& cond) {
    if (!next_state || !next_state->parent_)
        throw UserException(
            ::format("Next state for {0}.{1} cannot be null", parent_->fsm_name(), name_));
    // making sure that it's part of the same fsm state
    auto* parent = parent_;
    auto* state_ptr = next_state.get();
    while (parent->parent_fsm()) parent = parent->parent_fsm();
    auto* fsm = next_state->parent_;
    while (fsm && fsm != parent) {
        fsm = fsm->parent_fsm();
    }
    if (fsm != parent) {
        throw UserException(::format("FSM state {0} belongs to a different FSM {1} than {2}",
                                     next_state->name_, next_state->parent_->fsm_name(),
                                     parent->fsm_name()));
    }

    auto find_match = [this](Var *ptr) -> bool {
        auto it = std::find_if(transitions_.begin(), transitions_.end(), [ptr](auto const &pair) {
            return pair.first == ptr;
        });
        return it != transitions_.end();
    };

    if (!cond) {
        transitions_.emplace_back(std::make_pair(nullptr, state_ptr));
    } else {
        if (find_match(nullptr)) {
            // we have a slide through
            throw UserException("Unconditional transition has been assign to " + name_);
        }
        auto* ptr = cond.get();
        if (cond->width() != 1) throw VarException("Condition has to be a boolean value", {ptr});

        if (find_match(ptr)) {
            throw ::runtime_error(::format("{0} has been added to FSM {1}-{2} already",
                                           ptr->to_string(), parent_->fsm_name(), name_));
        }
        transitions_.emplace_back(std::make_pair(ptr, state_ptr));
    }
}